

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# auto_corr_to_refl_coef.c
# Opt level: O3

void WebRtcSpl_AutoCorrToReflCoef(int32_t *R,int use_order,int16_t *K)

{
  ushort uVar1;
  uint uVar2;
  int iVar3;
  byte bVar4;
  byte bVar5;
  int iVar6;
  short sVar7;
  int iVar8;
  long lVar9;
  ushort uVar10;
  uint uVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  short sVar15;
  ushort uVar16;
  int iVar17;
  bool bVar18;
  ushort local_98 [16];
  ushort auStack_78 [8];
  int16_t P [14];
  int16_t W [14];
  int16_t ACF [14];
  
  uVar2 = *R;
  if (uVar2 == 0) {
    bVar5 = 0;
  }
  else {
    uVar11 = (int)uVar2 >> 0x1f ^ uVar2;
    bVar4 = (uVar11 < 0x8000) * '\x10';
    bVar5 = bVar4 + 8;
    if (0x7fffff < uVar11 << bVar4) {
      bVar5 = bVar4;
    }
    bVar4 = bVar5 + 4;
    if (0x7ffffff < uVar11 << (bVar5 & 0x1f)) {
      bVar4 = bVar5;
    }
    bVar5 = bVar4 + 2;
    if (0x1fffffff < uVar11 << (bVar4 & 0x1f)) {
      bVar5 = bVar4;
    }
    bVar5 = bVar5 + (uVar11 << (bVar5 & 0x1f) < 0x40000000);
  }
  local_98[0] = (ushort)((uVar2 << (bVar5 & 0x1f)) >> 0x10);
  if (0 < use_order) {
    lVar9 = 0;
    do {
      uVar10 = (ushort)((uint)(R[lVar9 + 1] << (bVar5 & 0x1f)) >> 0x10);
      P[lVar9 + 9] = uVar10;
      auStack_78[lVar9 + 1] = uVar10;
      local_98[lVar9 + 1] = uVar10;
      lVar9 = lVar9 + 1;
    } while (use_order != (int)lVar9);
    if (0 < use_order) {
      uVar10 = -local_98[1];
      if (0 < (short)local_98[1]) {
        uVar10 = local_98[1];
      }
      if ((short)local_98[0] < (short)uVar10) {
        iVar6 = 1;
        iVar3 = -1;
      }
      else {
        iVar6 = 1;
        iVar8 = 0;
        iVar12 = use_order;
        do {
          iVar3 = iVar8;
          *K = 0;
          if (local_98[1] == 0) {
            sVar15 = 0;
          }
          else {
            iVar8 = (int)(short)uVar10;
            iVar17 = (int)(short)local_98[0];
            iVar13 = -0xf;
            sVar15 = 0;
            do {
              iVar8 = iVar8 * 2;
              sVar15 = (ushort)(iVar17 <= iVar8) + sVar15 * 2;
              iVar14 = 0;
              if (iVar17 <= iVar8) {
                iVar14 = iVar17;
              }
              iVar8 = iVar8 - iVar14;
              iVar13 = iVar13 + 1;
            } while (iVar13 != 0);
            *K = sVar15;
            if (0 < (short)local_98[1]) {
              sVar15 = -sVar15;
              *K = sVar15;
            }
          }
          if (iVar6 == use_order) {
            return;
          }
          iVar8 = (int)sVar15;
          sVar15 = (short)((short)local_98[1] * iVar8 + 0x4000U >> 0xf);
          sVar7 = local_98[0] + sVar15;
          bVar18 = SCARRY2(local_98[0],sVar15);
          local_98[0] = local_98[0] + sVar15;
          if (bVar18) {
            local_98[0] = sVar7 >> 0xf ^ 0x8000;
          }
          if (iVar6 < use_order) {
            lVar9 = 1;
            do {
              uVar10 = auStack_78[lVar9];
              uVar1 = local_98[lVar9 + 1];
              sVar15 = (short)((short)uVar1 * iVar8 + 0x4000U >> 0xf);
              uVar16 = sVar15 + uVar10;
              if (SCARRY2(sVar15,uVar10)) {
                uVar16 = (short)(uVar10 + sVar15) >> 0xf ^ 0x8000;
              }
              sVar15 = (short)((short)uVar10 * iVar8 + 0x4000U >> 0xf);
              uVar10 = uVar1 + sVar15;
              if (SCARRY2(uVar1,sVar15)) {
                uVar10 = (short)(uVar1 + sVar15) >> 0xf ^ 0x8000;
              }
              local_98[lVar9] = uVar10;
              auStack_78[lVar9] = uVar16;
              lVar9 = lVar9 + 1;
            } while (iVar12 != (int)lVar9);
          }
          iVar6 = iVar6 + 1;
          K = K + 1;
          uVar10 = -local_98[1];
          if (0 < (short)local_98[1]) {
            uVar10 = local_98[1];
          }
          iVar12 = iVar12 + -1;
          iVar8 = iVar3 + 1;
        } while ((short)uVar10 <= (short)local_98[0]);
        iVar3 = -2 - iVar3;
      }
      if (iVar6 <= use_order) {
        memset(K,0,(ulong)(uint)(iVar3 + use_order) * 2 + 2);
        return;
      }
    }
  }
  return;
}

Assistant:

void WebRtcSpl_AutoCorrToReflCoef(const int32_t *R, int use_order, int16_t *K)
{
    int i, n;
    int16_t tmp;
    const int32_t *rptr;
    int32_t L_num, L_den;
    int16_t *acfptr, *pptr, *wptr, *p1ptr, *w1ptr, ACF[WEBRTC_SPL_MAX_LPC_ORDER],
            P[WEBRTC_SPL_MAX_LPC_ORDER], W[WEBRTC_SPL_MAX_LPC_ORDER];

    // Initialize loop and pointers.
    acfptr = ACF;
    rptr = R;
    pptr = P;
    p1ptr = &P[1];
    w1ptr = &W[1];
    wptr = w1ptr;

    // First loop; n=0. Determine shifting.
    tmp = WebRtcSpl_NormW32(*R);
    *acfptr = (int16_t)((*rptr++ << tmp) >> 16);
    *pptr++ = *acfptr++;

    // Initialize ACF, P and W.
    for (i = 1; i <= use_order; i++)
    {
        *acfptr = (int16_t)((*rptr++ << tmp) >> 16);
        *wptr++ = *acfptr;
        *pptr++ = *acfptr++;
    }

    // Compute reflection coefficients.
    for (n = 1; n <= use_order; n++, K++)
    {
        tmp = WEBRTC_SPL_ABS_W16(*p1ptr);
        if (*P < tmp)
        {
            for (i = n; i <= use_order; i++)
                *K++ = 0;

            return;
        }

        // Division: WebRtcSpl_div(tmp, *P)
        *K = 0;
        if (tmp != 0)
        {
            L_num = tmp;
            L_den = *P;
            i = 15;
            while (i--)
            {
                (*K) <<= 1;
                L_num <<= 1;
                if (L_num >= L_den)
                {
                    L_num -= L_den;
                    (*K)++;
                }
            }
            if (*p1ptr > 0)
                *K = -*K;
        }

        // Last iteration; don't do Schur recursion.
        if (n == use_order)
            return;

        // Schur recursion.
        pptr = P;
        wptr = w1ptr;
        tmp = (int16_t)(((int32_t)*p1ptr * (int32_t)*K + 16384) >> 15);
        *pptr = WebRtcSpl_AddSatW16(*pptr, tmp);
        pptr++;
        for (i = 1; i <= use_order - n; i++)
        {
            tmp = (int16_t)(((int32_t)*wptr * (int32_t)*K + 16384) >> 15);
            *pptr = WebRtcSpl_AddSatW16(*(pptr + 1), tmp);
            pptr++;
            tmp = (int16_t)(((int32_t)*pptr * (int32_t)*K + 16384) >> 15);
            *wptr = WebRtcSpl_AddSatW16(*wptr, tmp);
            wptr++;
        }
    }
}